

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O0

int faup_snapshot_append_item(faup_snapshot_t *snapshot,char *item_name,faup_snapshot_item_t *item)

{
  faup_snapshot_item_t **ppfVar1;
  faup_snapshot_item_t *pfVar2;
  faup_snapshot_item_t *item_local;
  char *item_name_local;
  faup_snapshot_t *snapshot_local;
  
  if (snapshot == (faup_snapshot_t *)0x0) {
    fprintf(_stderr,"Cannot append item to an unexisting snapshot!\n");
    snapshot_local._4_4_ = -1;
  }
  else {
    ppfVar1 = (faup_snapshot_item_t **)realloc(snapshot->items,(snapshot->length + 1) * 8);
    snapshot->items = ppfVar1;
    if (snapshot->items == (faup_snapshot_item_t **)0x0) {
      fprintf(_stderr,"Cannot allocatate a snapshot_item!\n");
      snapshot_local._4_4_ = -1;
    }
    else {
      pfVar2 = faup_snapshot_item_copy(item);
      snapshot->items[snapshot->length] = pfVar2;
      snapshot->length = snapshot->length + 1;
      snapshot_local._4_4_ = 0;
    }
  }
  return snapshot_local._4_4_;
}

Assistant:

int faup_snapshot_append_item(faup_snapshot_t *snapshot, char *item_name, faup_snapshot_item_t *item)
{
  if (!snapshot) {
    fprintf(stderr, "Cannot append item to an unexisting snapshot!\n");
    return -1;
  }
  
  snapshot->items = realloc(snapshot->items, sizeof(faup_snapshot_item_t *) * (snapshot->length + 1));
  if (!snapshot->items) {
    fprintf(stderr, "Cannot allocatate a snapshot_item!\n");
    return -1;
  }

  snapshot->items[snapshot->length] = faup_snapshot_item_copy(item);
  
  snapshot->length++;
  
  return 0;
  
}